

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-attack.c
# Opt level: O3

_Bool py_attack_real(player *p,loc grid,_Bool *fear)

{
  short sVar1;
  monster_race *pmVar2;
  bool bVar3;
  unarmed_blow *puVar4;
  _Bool _Var5;
  _Bool _Var6;
  wchar_t wVar7;
  wchar_t wVar8;
  uint uVar9;
  uint32_t uVar10;
  wchar_t wVar11;
  int iVar12;
  monster_conflict *mon;
  object *weapon;
  object *obj;
  char *pcVar13;
  monster *pmVar14;
  ulong uVar15;
  player_blow *ppVar16;
  uint uVar17;
  byte bVar18;
  bitflag *pbVar19;
  int iVar20;
  byte bVar21;
  int iVar22;
  int iVar23;
  long lVar24;
  critical_level *this_l;
  critical_level *pcVar25;
  source sVar26;
  source origin;
  source origin_00;
  uint local_10c;
  wchar_t s;
  wchar_t b;
  bitflag *local_e8;
  undefined4 local_e0;
  uint32_t local_dc;
  char verb [20];
  char dmg_text [20];
  char m_name [80];
  
  mon = (monster_conflict *)square_monster(cave,grid);
  weapon = equipped_item_by_slot_name(p,"weapon");
  wVar7 = chance_of_melee_hit(p,weapon,mon);
  wVar8 = terrain_armor_adjust(grid,mon->race->ac,true);
  my_strcpy(dmg_text,"",0x14);
  my_strcpy(verb,"punch",0x14);
  monster_desc(m_name,0x50,(monster *)mon,L'\x15');
  _Var5 = monster_is_visible((monster *)mon);
  if (_Var5) {
    monster_race_track(p->upkeep,mon->race);
    health_track(p->upkeep,(monster *)mon);
  }
  _Var5 = player_of_has(p,L'\x1c');
  if (_Var5) {
    equip_learn_flag(p,L'\x1c');
    msgt(0x39,"You are too afraid to attack %s!",m_name);
    return false;
  }
  uVar15 = 0;
  iVar22 = 0;
  if (mon->m_timed[0] != 0) {
    _Var5 = monster_is_visible((monster *)mon);
    iVar22 = 0;
    if (_Var5) {
      sVar1 = p->lev;
      _Var5 = flag_has_dbg((p->state).pflags,10,0x2a,"p->state.pflags","(PF_BACKSTAB)");
      iVar22 = (int)(short)(sVar1 / 5 + 5) << _Var5;
    }
  }
  monster_wake(mon,false,L'd');
  mon_clear_timed((monster *)mon,L'\x06',L'\x01');
  uVar9 = wVar7 + iVar22;
  iVar23 = uVar9 - wVar8;
  if (uVar9 - wVar8 < 1) {
    iVar23 = 0;
  }
  if (0 < (int)uVar9) {
    uVar15 = (ulong)uVar9;
  }
  (mon->target).midx = L'\xffffffff';
  _Var5 = random_chance_check((random_chance)
                              ((ulong)(uint)((int)((uint)(iVar23 * 10000) / uVar15) * 9000) / 10000
                              + 0x2710000001f4));
  if (!_Var5) {
    msgt(3,"You miss %s.",m_name);
    if (p->timed[0x31] == 0) {
      return false;
    }
    uVar10 = Rand_div(0x32);
    if (uVar10 != 0) {
      return false;
    }
    msg("You feel strange...");
    player_over_exert(p,L'\x04',L'\x14',L'\x14');
    return false;
  }
  if (weapon != (object *)0x0) {
    object_weight_one(weapon);
    my_strcpy(verb,"hit",0x14);
  }
  b = L'\0';
  s = L'\0';
  if (2 < (p->body).count) {
    wVar7 = L'\x02';
    do {
      obj = slot_object(p,wVar7);
      if (obj != (object *)0x0) {
        improve_attack_modifier(p,obj,mon,&b,&s,verb,false);
      }
      wVar7 = wVar7 + L'\x01';
    } while ((uint)wVar7 < (uint)(p->body).count);
  }
  if (weapon != (object *)0x0) {
    improve_attack_modifier(p,weapon,mon,&b,&s,verb,false);
  }
  improve_attack_modifier(p,(object *)0x0,mon,&b,&s,verb,false);
  pbVar19 = (p->state).pflags;
  _Var5 = flag_has_dbg(pbVar19,10,0x2b,"p->state.pflags","(PF_UNARMED_COMBAT)");
  local_e8 = pbVar19;
  if ((_Var5) ||
     (_Var5 = flag_has_dbg(pbVar19,10,0x3e,"p->state.pflags","(PF_MARTIAL_ARTS)"), _Var5)) {
    pmVar2 = mon->race;
    wVar7 = (p->state).to_d;
    _Var5 = flag_has_dbg(pbVar19,10,0x3e,"p->state.pflags","(PF_MARTIAL_ARTS)");
    if (((_Var5) && (uVar10 = Rand_div(6), uVar10 == 0)) ||
       ((_Var5 = flag_has_dbg(pbVar19,10,0x3d,"p->state.pflags","(PF_POWER_STRIKE)"), _Var5 &&
        (uVar10 = Rand_div(8), uVar10 == 0)))) {
      bVar18 = 1;
    }
    else {
      bVar18 = 0;
    }
    if (wVar7 < L'\x01') {
      bVar21 = 0;
    }
    else {
      bVar21 = ""[(uint)wVar7];
    }
    wVar7 = (wchar_t)(short)(p->lev / 10 + 1);
    uVar10 = Rand_div(100);
    uVar17 = (uint)bVar21 * 0x29 >> 0xc;
    iVar23 = uVar17 + ((int)uVar10 < (int)(uint)(byte)(bVar21 + (char)uVar17 * -100)) + 2;
    do {
      wVar11 = Rand_div((p->lev * 2) / 5);
      puVar4 = unarmed_blows;
      wVar8 = wVar11 + L'\x01';
      if (wVar11 < wVar7) {
        wVar8 = wVar7;
      }
      wVar7 = wVar8;
      iVar23 = iVar23 + -1;
    } while (iVar23 != 0);
    wVar7 = (uint)(wVar7 < num_unarmed_blows & bVar18) + wVar7;
    if (num_unarmed_blows <= wVar7) {
      wVar7 = num_unarmed_blows;
    }
    _Var5 = flag_has_dbg(local_e8,10,0x4e,"p->state.pflags","(PF_HOLY_LIGHT)");
    uVar17 = 0;
    if (_Var5) {
      pbVar19 = pmVar2->flags;
      _Var5 = flag_has_dbg(pbVar19,0xc,0x49,"race->flags","RF_UNDEAD");
      uVar17 = 2;
      if (!_Var5) {
        _Var5 = flag_has_dbg(pbVar19,0xc,0x4c,"race->flags","RF_HURT_LIGHT");
        uVar17 = 2;
        if (!_Var5) {
          _Var5 = flag_has_dbg(pbVar19,0xc,0x48,"race->flags","RF_EVIL");
          uVar17 = (uint)_Var5;
        }
      }
    }
    iVar23 = puVar4[(long)wVar7 + -1].dd;
    iVar20 = uVar17 + puVar4[(long)wVar7 + -1].ds;
    if (bVar18 == 0) {
      wVar8 = damroll(iVar23,iVar20);
LAB_001b0b92:
      uVar10 = Rand_div(500);
      local_e0 = CONCAT31((int3)(uVar10 + 0x19 >> 8),(int)(uVar10 + 0x19) < (int)uVar9);
    }
    else {
      wVar8 = iVar20 * iVar23;
      uVar10 = Rand_div(3);
      if (uVar10 == 0) goto LAB_001b0b92;
      local_e0 = (undefined4)CONCAT71((uint7)(uint3)(uVar10 >> 8),1);
    }
    wVar11 = L'\x02';
    bVar3 = false;
  }
  else {
    if (weapon == (object *)0x0) {
      iVar23 = 0x14;
      local_10c = 1;
    }
    else {
      local_10c = (uint)weapon->dd;
      iVar23 = ((uint)weapon->ds + (uint)weapon->ds * 4) * 2 + 10;
    }
    if (s == L'\0') {
      if (b == L'\0') {
        wVar7 = L'\n';
      }
      else {
        wVar7 = get_monster_brand_multiplier(mon,brands + b);
      }
    }
    else {
      wVar7 = slays[s].multiplier;
    }
    _Var5 = flag_has_dbg((player->state).pflags,10,0x4e,"player->state.pflags","(PF_HOLY_LIGHT)");
    if (_Var5) {
      _Var5 = flag_has_dbg(mon->race->flags,0xc,0x49,"mon->race->flags","RF_UNDEAD");
      if ((_Var5) ||
         (_Var5 = flag_has_dbg(mon->race->flags,0xc,0x4c,"mon->race->flags","RF_HURT_LIGHT"), _Var5)
         ) {
        wVar8 = wVar7 + L'\n';
      }
      else {
        _Var5 = flag_has_dbg(mon->race->flags,0xc,0x48,"mon->race->flags","RF_EVIL");
        wVar8 = wVar7;
        if (!_Var5) goto LAB_001b0d01;
      }
      wVar7 = wVar8 / 10 + wVar7;
    }
LAB_001b0d01:
    wVar8 = (p->state).to_d;
    if (weapon == (object *)0x0) {
      wVar11 = L'\0';
    }
    else {
      wVar11 = object_to_dam(weapon);
    }
    uVar17 = wVar11 + wVar8;
    uVar9 = 0x96;
    if ((int)uVar17 < 0x96) {
      uVar9 = uVar17;
    }
    uVar15 = 0xffffff6a;
    if (-0x96 < (int)uVar9) {
      uVar15 = (ulong)uVar9;
    }
    if ((int)uVar17 < 0) {
      iVar20 = -10000;
      if (0x77 < (ulong)(uint)-(int)uVar15 - 0x1f) {
        uVar9 = -(uint)""[(uint)-(int)uVar15];
        goto LAB_001b0d6e;
      }
    }
    else {
      uVar9 = (uint)""[uVar15];
LAB_001b0d6e:
      iVar20 = iVar23 * wVar7 * (uVar9 + 100) + -10000;
    }
    local_dc = Rand_div(10000);
    _Var5 = monster_is_obvious((monster *)mon);
    if (((_Var5) && (_Var5 = flag_has_dbg(local_e8,10,0x38,"p->state.pflags","(PF_ARMSMAN)"), _Var5)
        ) && (uVar10 = Rand_div(z_info->m_armsman_chance), uVar10 == 0)) {
      bVar3 = true;
LAB_001b0e48:
      pcVar25 = z_info->m_crit_level_head;
      if (pcVar25 == (critical_level *)0x0) {
        wVar11 = L'\x02';
        uVar9 = 0;
      }
      else {
        while ((pcVar25->next != (critical_level *)0x0 &&
               (uVar10 = Rand_div(pcVar25->chance), uVar10 != 0))) {
          pcVar25 = pcVar25->next;
        }
        uVar17 = pcVar25->added_dice;
        wVar11 = pcVar25->msgt;
        uVar9 = 0;
        if (((uVar17 != 0) &&
            (_Var5 = flag_has_dbg(local_e8,10,0x3f,"p->state.pflags","(PF_MANA_BURN)"),
            uVar9 = uVar17, _Var5)) &&
           (_Var5 = monster_has_non_innate_spells((monster *)mon), _Var5)) {
          flag_on_dbg(mon->mflag,2,0xb,"mon->mflag","MFLAG_LESS_SPELL");
          uVar9 = uVar17 + z_info->m_manaburn_dice;
          msgt(2,"Mana Burn!");
        }
      }
    }
    else {
      wVar8 = chance_of_melee_hit(p,weapon,mon);
      iVar12 = ((wVar8 + iVar22) * z_info->m_crit_power_toh_scl_num) /
               z_info->m_crit_power_toh_scl_den;
      iVar23 = z_info->m_crit_chance_power_scl_num;
      uVar10 = Rand_div(iVar12 * z_info->m_crit_chance_power_scl_den + z_info->m_crit_chance_add_den
                       );
      bVar3 = false;
      wVar11 = L'\x02';
      uVar9 = 0;
      if ((int)uVar10 < iVar23 * iVar12) goto LAB_001b0e48;
    }
    iVar23 = damroll(uVar9 + local_10c,(uint)((int)local_dc < iVar20 % 10000) + iVar20 / 10000);
    wVar8 = wVar7 + iVar23 + L'\xfffffff6';
    bVar18 = 0;
    local_e0 = 0;
    wVar7 = L'\0';
  }
  _Var5 = player_of_has(p,L'\x11');
  local_dc = CONCAT31(local_dc._1_3_,L'2' < wVar8 && _Var5);
  if (L'2' < wVar8 && _Var5) {
    equip_learn_flag(p,L'\x11');
  }
  equip_learn_on_melee_attack(p);
  learn_brand_slay_from_melee(p,weapon,mon);
  _Var5 = player_is_shapechanged(p);
  if (_Var5) {
    uVar10 = Rand_div(p->shape->num_blows);
    ppVar16 = (player_blow *)&p->shape->blows;
    iVar23 = uVar10 + 1;
    do {
      ppVar16 = ppVar16->next;
      iVar23 = iVar23 + -1;
    } while (iVar23 != 0);
    my_strcpy(verb,ppVar16->name,0x14);
  }
  if (wVar8 < L'\x01') {
    my_strcpy(verb,"fail to harm",0x14);
    wVar8 = L'\0';
    wVar11 = L'\x03';
  }
  if ((p->opts).opt[3] == true) {
    pcVar13 = format(" (%d)",(ulong)(uint)wVar8);
    my_strcpy(dmg_text,pcVar13,0x14);
  }
  if ((weapon == (object *)0x0) &&
     ((_Var5 = flag_has_dbg(local_e8,10,0x2b,"p->state.pflags","(PF_UNARMED_COMBAT)"), _Var5 ||
      (_Var5 = flag_has_dbg(local_e8,10,0x3e,"p->state.pflags","(PF_MARTIAL_ARTS)"), _Var5)))) {
    if ((char)local_e0 == '\0') {
      if (bVar18 == 0) {
        pcVar13 = "You %s %s%s.";
      }
      else {
        pcVar13 = "Power Strike! You %s %s%s.";
      }
    }
    else {
      if (bVar18 != 0) {
        msgt(2,"Power Strike! You attempt to confuse %s%s.",m_name,dmg_text);
        goto LAB_001b120e;
      }
      pcVar13 = "You %s and attempt to confuse %s%s.";
    }
    msgt(2,pcVar13,unarmed_blows[(long)wVar7 + -1].name,m_name,dmg_text);
  }
  else {
    lVar24 = 8;
    do {
      if (wVar11 == *(wchar_t *)(&UNK_00283208 + lVar24)) {
        if ((iVar22 == 0) || (_Var5 = monster_is_visible((monster *)mon), !_Var5)) {
          pcVar13 = "Armsman hit!";
          if (bVar3) goto LAB_001b10e5;
        }
        else {
          _Var5 = flag_has_dbg(local_e8,10,0x2a,"p->state.pflags","(PF_BACKSTAB)");
          pcVar13 = "You rudely awaken the monster.";
          if ((uint)(wVar11 + L'\xffffff6d') < 2) {
            pcVar13 = "You ruthlessly sneak attack!";
          }
          if (!_Var5) {
            pcVar13 = "You rudely awaken the monster.";
          }
LAB_001b10e5:
          msgt(2,pcVar13);
        }
        if (*(long *)((long)&melee_hit_types[0].msg_type + lVar24) == 0) {
          msgt(wVar11,"You %s %s%s.",verb,m_name,dmg_text);
        }
        else {
          msgt(wVar11,"You %s %s%s. %s",verb,m_name,dmg_text);
        }
      }
      lVar24 = lVar24 + 0x10;
    } while (lVar24 != 0x78);
  }
LAB_001b120e:
  _Var5 = flag_has_dbg(local_e8,10,0x4a,"p->state.pflags","(PF_FURY)");
  if (_Var5) {
    wVar11 = (p->upkeep->energy_use * 3) /
             (int)((uint)"\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x03\x03\x03\x03\x03\x03\x03\x03\x04\x04\x04\x04\x04\x05\x05\x05\x05\x06\x06\a\a\b\t\n\v\f\r\x0e\x0f\x10\x11\x12\x13\x14\x15\x16\x17\x18\x19\x1a\x1b\x1c\x1d\x1e\x1f !\"#$$%%&&\'\'((()))***+++,,,,-----...../////0000011111111111111111111"
                         [(p->state).speed] * 2);
    wVar7 = L'\x01';
    if (L'\x01' < wVar11) {
      wVar7 = wVar11;
    }
    player_add_speed_boost(p,wVar7);
  }
  if (p->timed[0x27] != 0) {
    player_clear_timed(p,L'\'',true,false);
    uVar10 = Rand_div((int)p->lev);
    mon_inc_timed((monster *)mon,L'\x02',(int)uVar10 / 10 + L'\n',L'\x01');
  }
  wVar7 = (int)mon->hp;
  if (wVar8 < mon->hp) {
    wVar7 = wVar8;
  }
  _Var5 = mon_take_hit(mon,p,wVar8,fear,(char *)0x0);
  if ((p->timed[0x31] != 0) && (uVar10 = Rand_div(0x32), uVar10 == 0)) {
    msg("You feel something give way!");
    player_over_exert(p,L'\x01',L'\x14',L'\0');
  }
  if (_Var5) {
    *fear = false;
  }
  else if ((p->timed[0x2a] != 0) && (_Var6 = monster_is_living((monster *)mon), _Var6)) {
    sVar26 = source_player();
    origin.which = sVar26.which;
    pcVar13 = format("%d",(ulong)(uint)wVar7);
    origin._4_4_ = 0;
    origin.what = sVar26.what;
    effect_simple(L'\x03',origin,pcVar13,L'\0',L'\0',L'\0',L'\0',L'\0',(_Bool *)0x0);
  }
  if ((char)local_dc != '\0') {
    sVar26 = source_player();
    origin_00.which = sVar26.which;
    origin_00._4_4_ = 0;
    origin_00.what = sVar26.what;
    effect_simple(L'A',origin_00,"0",L'\0',L'\n',L'\0',L'\0',L'\0',(_Bool *)0x0);
    pmVar14 = square_monster(cave,grid);
    if (pmVar14 == (monster *)0x0) {
      _Var5 = true;
    }
  }
  return _Var5;
}

Assistant:

bool py_attack_real(struct player *p, struct loc grid, bool *fear)
{
	size_t i;

	/* Information about the target of the attack */
	struct monster *mon = square_monster(cave, grid);
	char m_name[80];
	bool stop = false;

	/* The weapon used */
	struct object *obj = equipped_item_by_slot_name(p, "weapon");

	/* Information about the attack */
	int chance = chance_of_melee_hit(p, obj, mon);
	int drain = 0;
	int splash = 0;
	bool do_quake = false;
	bool success = false;
	bool armsman = false;
	bool power_strike = false;
	bool confusing_blow = false;
	int unarmed_blow_idx = 0;

	/* Bonus to attack if monster is sleeping. */
	int sleeping_bonus = 0;

	int ac = terrain_armor_adjust(grid, mon->race->ac, true);

	char verb[20];
	uint32_t msg_type = MSG_HIT;
	char dmg_text[20];
	int j, b, s, weight, dmg;

	my_strcpy(dmg_text, "", sizeof(dmg_text));

	/* Default to punching */
	my_strcpy(verb, "punch", sizeof(verb));

	/* Extract monster name (or "it") */
	monster_desc(m_name, sizeof(m_name), mon, MDESC_TARG);

	/* Auto-Recall and track if possible and visible */
	if (monster_is_visible(mon)) {
		monster_race_track(p->upkeep, mon->race);
		health_track(p->upkeep, mon);
	}

	/* Handle player fear (only for invisible monsters) */
	if (player_of_has(p, OF_AFRAID)) {
		equip_learn_flag(p, OF_AFRAID);
		msgt(MSG_AFRAID, "You are too afraid to attack %s!", m_name);
		return false;
	}

	/* If the monster is sleeping and visible, it can be hit more easily. */
	if (mon->m_timed[MON_TMD_SLEEP] && monster_is_visible(mon)) {
		sleeping_bonus = 5 + p->lev / 5;
		if (player_has(p, PF_BACKSTAB)) {
			sleeping_bonus *= 2;
		}
	}

	/* Disturb the monster */
	monster_wake(mon, false, 100);
	mon_clear_timed(mon, MON_TMD_HOLD, MON_TMD_FLG_NOTIFY);

	/* Become hostile */
	mon->target.midx = -1;

	/* See if the player hit */
	success = test_hit(chance + sleeping_bonus, ac);

	/* If a miss, skip this hit */
	if (!success) {
		msgt(MSG_MISS, "You miss %s.", m_name);

		/* Small chance of bloodlust side-effects */
		if (p->timed[TMD_BLOODLUST] && one_in_(50)) {
			msg("You feel strange...");
			player_over_exert(p, PY_EXERT_SCRAMBLE, 20, 20);
		}

		return false;
	}

	if (obj) {
		/* Handle normal weapon */
		weight = object_weight_one(obj);
		my_strcpy(verb, "hit", sizeof(verb));
	} else {
		weight = 0;
	}

	/* Best attack from all slays or brands on all non-launcher equipment */
	b = 0;
	s = 0;
	for (j = 2; j < p->body.count; j++) {
		struct object *obj_local = slot_object(p, j);
		if (obj_local) {
			improve_attack_modifier(p, obj_local, mon, &b, &s, verb, false);
		}
	}

	/* Get the best attack from all slays or brands - weapon or temporary */
	if (obj) {
		improve_attack_modifier(p, obj, mon, &b, &s, verb, false);
	}
	improve_attack_modifier(p, NULL, mon, &b, &s, verb, false);

	if (player_has(p, PF_UNARMED_COMBAT) || player_has(p, PF_MARTIAL_ARTS)) {
		dmg = unarmed_damage(p, mon->race, chance + sleeping_bonus,
							 &unarmed_blow_idx, &power_strike, &confusing_blow);
	} else {
		/* Get the damage */
		dmg = melee_damage(p, mon, obj, b, s, sleeping_bonus, &msg_type,
						   &armsman);
	}

	/* Splash damage and earthquakes */
	splash = (weight * dmg) / 100;
	if (player_of_has(p, OF_IMPACT) && dmg > 50) {
		do_quake = true;
		equip_learn_flag(p, OF_IMPACT);
	}

	/* Learn by use */
	equip_learn_on_melee_attack(p);
	learn_brand_slay_from_melee(p, obj, mon);

	/* Substitute shape-specific blows for shapechanged players */
	if (player_is_shapechanged(p)) {
		int choice = randint0(p->shape->num_blows);
		struct player_blow *blow = p->shape->blows;
		while (choice--) {
			blow = blow->next;
		}
		my_strcpy(verb, blow->name, sizeof(verb));
	}

	/* No negative damage; change verb if no damage done */
	if (dmg <= 0) {
		dmg = 0;
		msg_type = MSG_MISS;
		my_strcpy(verb, "fail to harm", sizeof(verb));
	}

	/* Set damage value text if needed */
	if (OPT(p, show_damage)) {
		my_strcpy(dmg_text, format(" (%d)", dmg), sizeof(dmg_text));
	}

	/* Special messages for unarmed combat */
	if (!obj && (player_has(p, PF_UNARMED_COMBAT) ||
				 player_has(p, PF_MARTIAL_ARTS))) {
		const char *name = unarmed_blows[unarmed_blow_idx - 1].name;

		/* Display the attack message, feedback for relevant specialties */
		if (confusing_blow) {
			if (power_strike) {
				msgt(MSG_HIT, "Power Strike! You attempt to confuse %s%s.",
					 m_name, dmg_text);
			} else {
				msgt(MSG_HIT, "You %s and attempt to confuse %s%s.",
					 name, m_name, dmg_text);
			}
		} else {
			/* Basic attack message. */
			if (power_strike) {
				msgt(MSG_HIT, "Power Strike! You %s %s%s.", name, m_name,
					 dmg_text);
			} else {
				msgt(MSG_HIT, "You %s %s%s.", name, m_name, dmg_text);
			}
		}
	} else {
		for (i = 0; i < N_ELEMENTS(melee_hit_types); i++) {
			if (msg_type != melee_hit_types[i].msg_type) continue;

			/* Encourage the player to beat on sleeping monsters. */
			if (sleeping_bonus && monster_is_visible(mon)) {
				/* More "interesting" messages if we get a seriously good hit */
				if (player_has(p, PF_BACKSTAB) &&
					((msg_type == MSG_HIT_HI_GREAT)
					 || (msg_type == MSG_HIT_HI_SUPERB))) {
					msgt(MSG_HIT, "You ruthlessly sneak attack!");
				} else {
					/* Standard "wakeup call". */
					msgt(MSG_HIT, "You rudely awaken the monster.");
				}
			} else if (armsman) {
				/* Credit where credit is due, if no special message already */
				msgt(MSG_HIT, "Armsman hit!");
			}

			if (melee_hit_types[i].text)
				msgt(msg_type, "You %s %s%s. %s", verb, m_name, dmg_text,
					 melee_hit_types[i].text);
			else
				msgt(msg_type, "You %s %s%s.", verb, m_name, dmg_text);
		}
	}

	/* Specialty ability Fury */
	if (player_has(p, PF_FURY)) {
		fury_boost(p);
	}

	/* Pre-damage side effects */
	blow_side_effects(p, mon);

	/* Damage, check for hp drain, fear and death */
	drain = MIN(mon->hp, dmg);
	stop = mon_take_hit(mon, p, dmg, fear, NULL);

	/* Small chance of bloodlust side-effects */
	if (p->timed[TMD_BLOODLUST] && one_in_(50)) {
		msg("You feel something give way!");
		player_over_exert(p, PY_EXERT_CON, 20, 0);
	}

	if (!stop) {
		if (p->timed[TMD_ATT_VAMP] && monster_is_living(mon)) {
			effect_simple(EF_HEAL_HP, source_player(), format("%d", drain),
						  0, 0, 0, 0, 0, NULL);
		}
	}

	if (stop)
		(*fear) = false;

	/* Post-damage effects */
	if (blow_after_effects(grid, dmg, splash, fear, do_quake))
		stop = true;

	return stop;
}